

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-pprint.cc
# Opt level: O2

ostream * std::operator<<(ostream *os,half2 *v)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(os,"(");
  operator<<(poVar1,v->_M_elems);
  poVar1 = std::operator<<(poVar1,", ");
  operator<<(poVar1,v->_M_elems + 1);
  std::operator<<(poVar1,")");
  return os;
}

Assistant:

std::ostream &operator<<(std::ostream &os, const tinyusdz::value::half2 &v) {
  os << "(" << v[0] << ", " << v[1] << ")";
  return os;
}